

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

int Kit_TruthBestCofVar(uint *pTruth,int nVars,uint *pCof0,uint *pCof1)

{
  int iVar1;
  int iVar2;
  int local_48;
  int nSuppSizeMin;
  int nSuppSizeCur;
  int nSuppSizeCur1;
  int nSuppSizeCur0;
  int iBestVar;
  int i;
  uint *pCof1_local;
  uint *pCof0_local;
  int nVars_local;
  uint *pTruth_local;
  
  iVar1 = Kit_TruthIsConst0(pTruth,nVars);
  if ((iVar1 != 0) || (iVar1 = Kit_TruthIsConst1(pTruth,nVars), iVar1 != 0)) {
    return -1;
  }
  nSuppSizeCur1 = -1;
  local_48 = 100000000;
  for (nSuppSizeCur0 = 0; nSuppSizeCur0 < nVars; nSuppSizeCur0 = nSuppSizeCur0 + 1) {
    Kit_TruthCofactor0New(pCof0,pTruth,nVars,nSuppSizeCur0);
    Kit_TruthCofactor1New(pCof1,pTruth,nVars,nSuppSizeCur0);
    iVar1 = Kit_TruthSupportSize(pCof0,nVars);
    iVar2 = Kit_TruthSupportSize(pCof1,nVars);
    if (iVar1 + iVar2 < local_48) {
      nSuppSizeCur1 = nSuppSizeCur0;
      local_48 = iVar1 + iVar2;
    }
  }
  if (nSuppSizeCur1 != -1) {
    Kit_TruthCofactor0New(pCof0,pTruth,nVars,nSuppSizeCur1);
    Kit_TruthCofactor1New(pCof1,pTruth,nVars,nSuppSizeCur1);
    return nSuppSizeCur1;
  }
  __assert_fail("iBestVar != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitTruth.c"
                ,0x56c,
                "int Kit_TruthBestCofVar(unsigned int *, int, unsigned int *, unsigned int *)");
}

Assistant:

int Kit_TruthBestCofVar( unsigned * pTruth, int nVars, unsigned * pCof0, unsigned * pCof1 )
{
    int i, iBestVar, nSuppSizeCur0, nSuppSizeCur1, nSuppSizeCur, nSuppSizeMin;
    if ( Kit_TruthIsConst0(pTruth, nVars) || Kit_TruthIsConst1(pTruth, nVars) )
        return -1;
    // iterate through variables
    iBestVar = -1;
    nSuppSizeMin = KIT_INFINITY;
    for ( i = 0; i < nVars; i++ )
    {
        // cofactor the functiona and get support sizes
        Kit_TruthCofactor0New( pCof0, pTruth, nVars, i );
        Kit_TruthCofactor1New( pCof1, pTruth, nVars, i );
        nSuppSizeCur0 = Kit_TruthSupportSize( pCof0, nVars );
        nSuppSizeCur1 = Kit_TruthSupportSize( pCof1, nVars );
        nSuppSizeCur  = nSuppSizeCur0 + nSuppSizeCur1;
        // compare this variable with other variables
        if ( nSuppSizeMin > nSuppSizeCur ) 
        {
            nSuppSizeMin = nSuppSizeCur;
            iBestVar = i;
        }
    }
    assert( iBestVar != -1 );
    // cofactor w.r.t. this variable
    Kit_TruthCofactor0New( pCof0, pTruth, nVars, iBestVar );
    Kit_TruthCofactor1New( pCof1, pTruth, nVars, iBestVar );
    return iBestVar;
}